

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint uVar39;
  uint8_t *puVar40;
  short sVar41;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar42 [16];
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar125 [16];
  short sVar126;
  ushort uVar127;
  ushort uVar128;
  short sVar132;
  ushort uVar133;
  ushort uVar134;
  short sVar135;
  ushort uVar136;
  ushort uVar137;
  short sVar138;
  ushort uVar139;
  ushort uVar140;
  short sVar141;
  ushort uVar142;
  ushort uVar143;
  short sVar144;
  ushort uVar145;
  ushort uVar146;
  short sVar147;
  ushort uVar148;
  ushort uVar149;
  short sVar150;
  ushort uVar151;
  ushort uVar152;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  
  auVar42 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  uVar1 = *(ulong *)left_column;
  sVar48 = auVar42._0_2_;
  sVar49 = auVar42._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._12_3_ = auVar3._12_3_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[10] = (char)(uVar1 >> 0x28);
  auVar11._11_4_ = auVar7._11_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15._10_5_ = auVar11._10_5_;
  auVar19[8] = (char)(uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar19._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = (char)(uVar1 >> 0x18);
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = (char)(uVar1 >> 0x10);
  auVar32._11_4_ = 0;
  auVar26[2] = (char)(uVar1 >> 8);
  auVar26._0_2_ = (ushort)uVar1;
  auVar26._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar42._0_2_ = (ushort)uVar1 & 0xff;
  auVar42._2_13_ = auVar26._2_13_;
  auVar42[0xf] = 0;
  sVar50 = sVar48 + 0x80;
  sVar51 = sVar49 * 8 + 0x80;
  sVar52 = sVar48 * 0x10 + 0x80;
  sVar53 = sVar49 * 0x17 + 0x80;
  sVar54 = sVar48 * 0x1f + 0x80;
  sVar55 = sVar49 * 0x26 + 0x80;
  sVar56 = sVar48 * 0x2e + 0x80;
  sVar57 = sVar49 * 0x35 + 0x80;
  sVar58 = sVar48 * 0x3c + 0x80;
  sVar59 = sVar49 * 0x43 + 0x80;
  sVar60 = sVar48 * 0x4a + 0x80;
  sVar61 = sVar49 * 0x50 + 0x80;
  sVar62 = sVar48 * 0x57 + 0x80;
  sVar63 = sVar49 * 0x5d + 0x80;
  sVar64 = sVar48 * 100 + 0x80;
  sVar65 = sVar49 * 0x6a + 0x80;
  sVar66 = sVar48 * 0x70 + 0x80;
  sVar67 = sVar49 * 0x76 + 0x80;
  sVar68 = sVar48 * 0x7b + 0x80;
  sVar69 = sVar49 * 0x81 + 0x80;
  sVar70 = sVar48 * 0x87 + 0x80;
  sVar71 = sVar49 * 0x8c + 0x80;
  sVar72 = sVar48 * 0x91 + 0x80;
  sVar73 = sVar49 * 0x96 + 0x80;
  sVar74 = sVar48 * 0x9b + 0x80;
  sVar75 = sVar49 * 0xa0 + 0x80;
  sVar76 = sVar48 * 0xa5 + 0x80;
  sVar77 = sVar49 * 0xaa + 0x80;
  sVar78 = sVar48 * 0xae + 0x80;
  sVar79 = sVar49 * 0xb3 + 0x80;
  sVar80 = sVar48 * 0xb7 + 0x80;
  sVar81 = sVar49 * 0xbb + 0x80;
  sVar82 = sVar48 * 0xbf + 0x80;
  sVar83 = sVar49 * 0xc3 + 0x80;
  sVar84 = sVar48 * 199 + 0x80;
  sVar85 = sVar49 * 0xca + 0x80;
  sVar86 = sVar48 * 0xce + 0x80;
  sVar87 = sVar49 * 0xd1 + 0x80;
  sVar88 = sVar48 * 0xd4 + 0x80;
  sVar89 = sVar49 * 0xd7 + 0x80;
  sVar90 = sVar48 * 0xda + 0x80;
  sVar91 = sVar49 * 0xdd + 0x80;
  sVar92 = sVar48 * 0xe0 + 0x80;
  sVar93 = sVar49 * 0xe3 + 0x80;
  sVar94 = sVar48 * 0xe5 + 0x80;
  sVar95 = sVar49 * 0xe7 + 0x80;
  sVar96 = sVar48 * 0xea + 0x80;
  sVar97 = sVar49 * 0xec + 0x80;
  sVar98 = sVar48 * 0xee + 0x80;
  sVar99 = sVar49 * 0xf0 + 0x80;
  sVar100 = sVar48 * 0xf1 + 0x80;
  sVar101 = sVar49 * 0xf3 + 0x80;
  sVar102 = sVar48 * 0xf4 + 0x80;
  sVar103 = sVar49 * 0xf6 + 0x80;
  sVar104 = sVar48 * 0xf7 + 0x80;
  sVar105 = sVar49 * 0xf8 + 0x80;
  sVar41 = sVar48 * 0xf9 + 0x80;
  sVar43 = sVar49 * 0xfa + 0x80;
  sVar44 = sVar48 * 0xfa + 0x80;
  sVar45 = sVar49 * 0xfb + 0x80;
  sVar46 = sVar48 * 0xfb + 0x80;
  sVar47 = sVar49 * 0xfc + 0x80;
  sVar48 = sVar48 * 0xfc + 0x80;
  sVar49 = sVar49 * 0xfc + 0x80;
  puVar40 = dst + 0x30;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar125._4_4_ = uVar39;
    auVar125._0_4_ = uVar39;
    auVar125._8_4_ = uVar39;
    auVar125._12_4_ = uVar39;
    auVar125 = pshufb(auVar42,auVar125);
    sVar126 = auVar125._0_2_;
    sVar132 = auVar125._2_2_;
    sVar135 = auVar125._4_2_;
    sVar138 = auVar125._6_2_;
    sVar141 = auVar125._8_2_;
    sVar144 = auVar125._10_2_;
    sVar147 = auVar125._12_2_;
    sVar150 = auVar125._14_2_;
    uVar127 = sVar126 * 0xff + sVar50;
    uVar133 = sVar132 * 0xf8 + sVar51;
    uVar136 = sVar135 * 0xf0 + sVar52;
    uVar139 = sVar138 * 0xe9 + sVar53;
    uVar142 = sVar141 * 0xe1 + sVar54;
    uVar145 = sVar144 * 0xda + sVar55;
    uVar148 = sVar147 * 0xd2 + sVar56;
    uVar151 = sVar150 * 0xcb + sVar57;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    uVar106 = sVar126 * 0xc4 + sVar58;
    uVar111 = sVar132 * 0xbd + sVar59;
    uVar113 = sVar135 * 0xb6 + sVar60;
    uVar115 = sVar138 * 0xb0 + sVar61;
    uVar117 = sVar141 * 0xa9 + sVar62;
    uVar119 = sVar144 * 0xa3 + sVar63;
    uVar121 = sVar147 * 0x9c + sVar64;
    uVar123 = sVar150 * 0x96 + sVar65;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    puVar40[-0x30] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x2f] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x2e] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x2d] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x2c] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x2b] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x2a] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x29] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    puVar40[-0x28] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x27] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x26] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x25] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x24] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x23] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x22] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x21] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    uVar106 = sVar126 * 0x90 + sVar66;
    uVar111 = sVar132 * 0x8a + sVar67;
    uVar113 = sVar135 * 0x85 + sVar68;
    uVar115 = sVar138 * 0x7f + sVar69;
    uVar117 = sVar141 * 0x79 + sVar70;
    uVar119 = sVar144 * 0x74 + sVar71;
    uVar121 = sVar147 * 0x6f + sVar72;
    uVar123 = sVar150 * 0x6a + sVar73;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x65 + sVar74;
    uVar133 = sVar132 * 0x60 + sVar75;
    uVar136 = sVar135 * 0x5b + sVar76;
    uVar139 = sVar138 * 0x56 + sVar77;
    uVar142 = sVar141 * 0x52 + sVar78;
    uVar145 = sVar144 * 0x4d + sVar79;
    uVar148 = sVar147 * 0x49 + sVar80;
    uVar151 = sVar150 * 0x45 + sVar81;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x20] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x1f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x1d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x1c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x1b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x1a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x19] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x17] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x16] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x15] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x14] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x13] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x12] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x11] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x41 + sVar82;
    uVar111 = sVar132 * 0x3d + sVar83;
    uVar113 = sVar135 * 0x39 + sVar84;
    uVar115 = sVar138 * 0x36 + sVar85;
    uVar117 = sVar141 * 0x32 + sVar86;
    uVar119 = sVar144 * 0x2f + sVar87;
    uVar121 = sVar147 * 0x2c + sVar88;
    uVar123 = sVar150 * 0x29 + sVar89;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x26 + sVar90;
    uVar133 = sVar132 * 0x23 + sVar91;
    uVar136 = sVar135 * 0x20 + sVar92;
    uVar139 = sVar138 * 0x1d + sVar93;
    uVar142 = sVar141 * 0x1b + sVar94;
    uVar145 = sVar144 * 0x19 + sVar95;
    uVar148 = sVar147 * 0x16 + sVar96;
    uVar151 = sVar150 * 0x14 + sVar97;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x10] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0xf] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0xb] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-10] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-7] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-6] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-5] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-3] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-2] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-1] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x12 + sVar98;
    uVar111 = sVar132 * 0x10 + sVar99;
    uVar113 = sVar135 * 0xf + sVar100;
    uVar115 = sVar138 * 0xd + sVar101;
    uVar117 = sVar141 * 0xc + sVar102;
    uVar119 = sVar144 * 10 + sVar103;
    uVar121 = sVar147 * 9 + sVar104;
    uVar123 = sVar150 * 8 + sVar105;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 7 + sVar41;
    uVar133 = sVar132 * 6 + sVar43;
    uVar136 = sVar135 * 6 + sVar44;
    uVar139 = sVar138 * 5 + sVar45;
    uVar142 = sVar141 * 5 + sVar46;
    uVar145 = sVar144 * 4 + sVar47;
    uVar148 = sVar147 * 4 + sVar48;
    uVar151 = sVar150 * 4 + sVar49;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    *puVar40 = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[4] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[5] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[6] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[7] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[9] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[10] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[0xb] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[0xc] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[0xd] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[0xe] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[0xf] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    puVar40 = puVar40 + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xc] = (char)(uVar1 >> 0x30);
  auVar8._13_2_ = auVar4._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[10] = (char)(uVar1 >> 0x28);
  auVar16._11_4_ = auVar12._11_4_;
  auVar20._8_2_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20._10_5_ = auVar16._10_5_;
  auVar23[8] = (char)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = (char)(uVar1 >> 0x18);
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = (char)(uVar1 >> 0x10);
  auVar34._11_4_ = 0;
  auVar108._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar108[2] = (char)(uVar1 >> 8);
  auVar108[0] = (byte)uVar1;
  auVar108[1] = 0;
  auVar108[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar129._4_4_ = uVar39;
    auVar129._0_4_ = uVar39;
    auVar129._8_4_ = uVar39;
    auVar129._12_4_ = uVar39;
    auVar42 = pshufb(auVar108,auVar129);
    sVar126 = auVar42._0_2_;
    sVar132 = auVar42._2_2_;
    sVar135 = auVar42._4_2_;
    sVar138 = auVar42._6_2_;
    sVar141 = auVar42._8_2_;
    sVar144 = auVar42._10_2_;
    sVar147 = auVar42._12_2_;
    sVar150 = auVar42._14_2_;
    uVar106 = sVar126 * 0xff + sVar50;
    uVar111 = sVar132 * 0xf8 + sVar51;
    uVar113 = sVar135 * 0xf0 + sVar52;
    uVar115 = sVar138 * 0xe9 + sVar53;
    uVar117 = sVar141 * 0xe1 + sVar54;
    uVar119 = sVar144 * 0xda + sVar55;
    uVar121 = sVar147 * 0xd2 + sVar56;
    uVar123 = sVar150 * 0xcb + sVar57;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar58;
    uVar133 = sVar132 * 0xbd + sVar59;
    uVar136 = sVar135 * 0xb6 + sVar60;
    uVar139 = sVar138 * 0xb0 + sVar61;
    uVar142 = sVar141 * 0xa9 + sVar62;
    uVar145 = sVar144 * 0xa3 + sVar63;
    uVar148 = sVar147 * 0x9c + sVar64;
    uVar151 = sVar150 * 0x96 + sVar65;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x30] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x2f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x2d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x2c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x2b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x2a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x29] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x27] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x26] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x25] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x24] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x23] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x22] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x21] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x90 + sVar66;
    uVar111 = sVar132 * 0x8a + sVar67;
    uVar113 = sVar135 * 0x85 + sVar68;
    uVar115 = sVar138 * 0x7f + sVar69;
    uVar117 = sVar141 * 0x79 + sVar70;
    uVar119 = sVar144 * 0x74 + sVar71;
    uVar121 = sVar147 * 0x6f + sVar72;
    uVar123 = sVar150 * 0x6a + sVar73;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x65 + sVar74;
    uVar133 = sVar132 * 0x60 + sVar75;
    uVar136 = sVar135 * 0x5b + sVar76;
    uVar139 = sVar138 * 0x56 + sVar77;
    uVar142 = sVar141 * 0x52 + sVar78;
    uVar145 = sVar144 * 0x4d + sVar79;
    uVar148 = sVar147 * 0x49 + sVar80;
    uVar151 = sVar150 * 0x45 + sVar81;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x20] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x1f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x1d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x1c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x1b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x1a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x19] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x17] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x16] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x15] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x14] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x13] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x12] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x11] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x41 + sVar82;
    uVar111 = sVar132 * 0x3d + sVar83;
    uVar113 = sVar135 * 0x39 + sVar84;
    uVar115 = sVar138 * 0x36 + sVar85;
    uVar117 = sVar141 * 0x32 + sVar86;
    uVar119 = sVar144 * 0x2f + sVar87;
    uVar121 = sVar147 * 0x2c + sVar88;
    uVar123 = sVar150 * 0x29 + sVar89;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x26 + sVar90;
    uVar133 = sVar132 * 0x23 + sVar91;
    uVar136 = sVar135 * 0x20 + sVar92;
    uVar139 = sVar138 * 0x1d + sVar93;
    uVar142 = sVar141 * 0x1b + sVar94;
    uVar145 = sVar144 * 0x19 + sVar95;
    uVar148 = sVar147 * 0x16 + sVar96;
    uVar151 = sVar150 * 0x14 + sVar97;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x10] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0xf] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0xb] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-10] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-7] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-6] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-5] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-3] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-2] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-1] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar127 = sVar126 * 0x12 + sVar98;
    uVar133 = sVar132 * 0x10 + sVar99;
    uVar136 = sVar135 * 0xf + sVar100;
    uVar139 = sVar138 * 0xd + sVar101;
    uVar142 = sVar141 * 0xc + sVar102;
    uVar145 = sVar144 * 10 + sVar103;
    uVar148 = sVar147 * 9 + sVar104;
    uVar151 = sVar150 * 8 + sVar105;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    uVar106 = sVar126 * 7 + sVar41;
    uVar111 = sVar132 * 6 + sVar43;
    uVar113 = sVar135 * 6 + sVar44;
    uVar115 = sVar138 * 5 + sVar45;
    uVar117 = sVar141 * 5 + sVar46;
    uVar119 = sVar144 * 4 + sVar47;
    uVar121 = sVar147 * 4 + sVar48;
    uVar123 = sVar150 * 4 + sVar49;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    *puVar40 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[1] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[2] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[3] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[5] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[6] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[7] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    puVar40[8] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[9] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[10] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xb] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xd] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[0xe] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[0xf] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40 = puVar40 + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 0x10);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)(uVar1 >> 0x30);
  auVar9._13_2_ = auVar5._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[10] = (char)(uVar1 >> 0x28);
  auVar17._11_4_ = auVar13._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_5_ = auVar17._10_5_;
  auVar24[8] = (char)(uVar1 >> 0x20);
  auVar24._0_8_ = uVar1;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar35[0] = (char)(uVar1 >> 0x18);
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = (char)(uVar1 >> 0x10);
  auVar36._11_4_ = 0;
  auVar109._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar109[2] = (char)(uVar1 >> 8);
  auVar109[0] = (byte)uVar1;
  auVar109[1] = 0;
  auVar109[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar130._4_4_ = uVar39;
    auVar130._0_4_ = uVar39;
    auVar130._8_4_ = uVar39;
    auVar130._12_4_ = uVar39;
    auVar42 = pshufb(auVar109,auVar130);
    sVar126 = auVar42._0_2_;
    sVar132 = auVar42._2_2_;
    sVar135 = auVar42._4_2_;
    sVar138 = auVar42._6_2_;
    sVar141 = auVar42._8_2_;
    sVar144 = auVar42._10_2_;
    sVar147 = auVar42._12_2_;
    sVar150 = auVar42._14_2_;
    uVar106 = sVar126 * 0xff + sVar50;
    uVar111 = sVar132 * 0xf8 + sVar51;
    uVar113 = sVar135 * 0xf0 + sVar52;
    uVar115 = sVar138 * 0xe9 + sVar53;
    uVar117 = sVar141 * 0xe1 + sVar54;
    uVar119 = sVar144 * 0xda + sVar55;
    uVar121 = sVar147 * 0xd2 + sVar56;
    uVar123 = sVar150 * 0xcb + sVar57;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar58;
    uVar133 = sVar132 * 0xbd + sVar59;
    uVar136 = sVar135 * 0xb6 + sVar60;
    uVar139 = sVar138 * 0xb0 + sVar61;
    uVar142 = sVar141 * 0xa9 + sVar62;
    uVar145 = sVar144 * 0xa3 + sVar63;
    uVar148 = sVar147 * 0x9c + sVar64;
    uVar151 = sVar150 * 0x96 + sVar65;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x30] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x2f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x2d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x2c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x2b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x2a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x29] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x27] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x26] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x25] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x24] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x23] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x22] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x21] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x90 + sVar66;
    uVar111 = sVar132 * 0x8a + sVar67;
    uVar113 = sVar135 * 0x85 + sVar68;
    uVar115 = sVar138 * 0x7f + sVar69;
    uVar117 = sVar141 * 0x79 + sVar70;
    uVar119 = sVar144 * 0x74 + sVar71;
    uVar121 = sVar147 * 0x6f + sVar72;
    uVar123 = sVar150 * 0x6a + sVar73;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x65 + sVar74;
    uVar133 = sVar132 * 0x60 + sVar75;
    uVar136 = sVar135 * 0x5b + sVar76;
    uVar139 = sVar138 * 0x56 + sVar77;
    uVar142 = sVar141 * 0x52 + sVar78;
    uVar145 = sVar144 * 0x4d + sVar79;
    uVar148 = sVar147 * 0x49 + sVar80;
    uVar151 = sVar150 * 0x45 + sVar81;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x20] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x1f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x1d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x1c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x1b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x1a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x19] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x17] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x16] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x15] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x14] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x13] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x12] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x11] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x41 + sVar82;
    uVar111 = sVar132 * 0x3d + sVar83;
    uVar113 = sVar135 * 0x39 + sVar84;
    uVar115 = sVar138 * 0x36 + sVar85;
    uVar117 = sVar141 * 0x32 + sVar86;
    uVar119 = sVar144 * 0x2f + sVar87;
    uVar121 = sVar147 * 0x2c + sVar88;
    uVar123 = sVar150 * 0x29 + sVar89;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x26 + sVar90;
    uVar133 = sVar132 * 0x23 + sVar91;
    uVar136 = sVar135 * 0x20 + sVar92;
    uVar139 = sVar138 * 0x1d + sVar93;
    uVar142 = sVar141 * 0x1b + sVar94;
    uVar145 = sVar144 * 0x19 + sVar95;
    uVar148 = sVar147 * 0x16 + sVar96;
    uVar151 = sVar150 * 0x14 + sVar97;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x10] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0xf] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0xb] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-10] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-7] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-6] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-5] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-3] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-2] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-1] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar127 = sVar126 * 0x12 + sVar98;
    uVar133 = sVar132 * 0x10 + sVar99;
    uVar136 = sVar135 * 0xf + sVar100;
    uVar139 = sVar138 * 0xd + sVar101;
    uVar142 = sVar141 * 0xc + sVar102;
    uVar145 = sVar144 * 10 + sVar103;
    uVar148 = sVar147 * 9 + sVar104;
    uVar151 = sVar150 * 8 + sVar105;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    uVar106 = sVar126 * 7 + sVar41;
    uVar111 = sVar132 * 6 + sVar43;
    uVar113 = sVar135 * 6 + sVar44;
    uVar115 = sVar138 * 5 + sVar45;
    uVar117 = sVar141 * 5 + sVar46;
    uVar119 = sVar144 * 4 + sVar47;
    uVar121 = sVar147 * 4 + sVar48;
    uVar123 = sVar150 * 4 + sVar49;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    *puVar40 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[1] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[2] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[3] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[5] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[6] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[7] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    puVar40[8] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[9] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[10] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xb] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xd] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[0xe] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[0xf] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40 = puVar40 + stride;
  } while (uVar39 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 0x18);
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xe] = (char)(uVar1 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xc] = (char)(uVar1 >> 0x30);
  auVar10._13_2_ = auVar6._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[10] = (char)(uVar1 >> 0x28);
  auVar18._11_4_ = auVar14._11_4_;
  auVar22._8_2_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._10_5_ = auVar18._10_5_;
  auVar25[8] = (char)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar37._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar37[0] = (char)(uVar1 >> 0x18);
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = (char)(uVar1 >> 0x10);
  auVar38._11_4_ = 0;
  auVar110._3_12_ = SUB1512(auVar38 << 0x20,3);
  auVar110[2] = (char)(uVar1 >> 8);
  auVar110[0] = (byte)uVar1;
  auVar110[1] = 0;
  auVar110[0xf] = 0;
  uVar39 = 0xfefdfefe;
  do {
    uVar39 = uVar39 + 0x2020202;
    auVar131._4_4_ = uVar39;
    auVar131._0_4_ = uVar39;
    auVar131._8_4_ = uVar39;
    auVar131._12_4_ = uVar39;
    auVar42 = pshufb(auVar110,auVar131);
    sVar126 = auVar42._0_2_;
    sVar132 = auVar42._2_2_;
    sVar135 = auVar42._4_2_;
    sVar138 = auVar42._6_2_;
    sVar141 = auVar42._8_2_;
    sVar144 = auVar42._10_2_;
    sVar147 = auVar42._12_2_;
    sVar150 = auVar42._14_2_;
    uVar106 = sVar126 * 0xff + sVar50;
    uVar111 = sVar132 * 0xf8 + sVar51;
    uVar113 = sVar135 * 0xf0 + sVar52;
    uVar115 = sVar138 * 0xe9 + sVar53;
    uVar117 = sVar141 * 0xe1 + sVar54;
    uVar119 = sVar144 * 0xda + sVar55;
    uVar121 = sVar147 * 0xd2 + sVar56;
    uVar123 = sVar150 * 0xcb + sVar57;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0xc4 + sVar58;
    uVar133 = sVar132 * 0xbd + sVar59;
    uVar136 = sVar135 * 0xb6 + sVar60;
    uVar139 = sVar138 * 0xb0 + sVar61;
    uVar142 = sVar141 * 0xa9 + sVar62;
    uVar145 = sVar144 * 0xa3 + sVar63;
    uVar148 = sVar147 * 0x9c + sVar64;
    uVar151 = sVar150 * 0x96 + sVar65;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x30] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x2f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x2d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x2c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x2b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x2a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x29] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x28] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x27] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x26] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x25] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x24] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x23] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x22] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x21] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x90 + sVar66;
    uVar111 = sVar132 * 0x8a + sVar67;
    uVar113 = sVar135 * 0x85 + sVar68;
    uVar115 = sVar138 * 0x7f + sVar69;
    uVar117 = sVar141 * 0x79 + sVar70;
    uVar119 = sVar144 * 0x74 + sVar71;
    uVar121 = sVar147 * 0x6f + sVar72;
    uVar123 = sVar150 * 0x6a + sVar73;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x65 + sVar74;
    uVar133 = sVar132 * 0x60 + sVar75;
    uVar136 = sVar135 * 0x5b + sVar76;
    uVar139 = sVar138 * 0x56 + sVar77;
    uVar142 = sVar141 * 0x52 + sVar78;
    uVar145 = sVar144 * 0x4d + sVar79;
    uVar148 = sVar147 * 0x49 + sVar80;
    uVar151 = sVar150 * 0x45 + sVar81;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x20] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0x1f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0x1d] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0x1c] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0x1b] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-0x1a] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-0x19] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-0x18] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-0x17] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-0x16] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-0x15] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-0x14] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-0x13] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-0x12] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-0x11] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar106 = sVar126 * 0x41 + sVar82;
    uVar111 = sVar132 * 0x3d + sVar83;
    uVar113 = sVar135 * 0x39 + sVar84;
    uVar115 = sVar138 * 0x36 + sVar85;
    uVar117 = sVar141 * 0x32 + sVar86;
    uVar119 = sVar144 * 0x2f + sVar87;
    uVar121 = sVar147 * 0x2c + sVar88;
    uVar123 = sVar150 * 0x29 + sVar89;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = sVar126 * 0x26 + sVar90;
    uVar133 = sVar132 * 0x23 + sVar91;
    uVar136 = sVar135 * 0x20 + sVar92;
    uVar139 = sVar138 * 0x1d + sVar93;
    uVar142 = sVar141 * 0x1b + sVar94;
    uVar145 = sVar144 * 0x19 + sVar95;
    uVar148 = sVar147 * 0x16 + sVar96;
    uVar151 = sVar150 * 0x14 + sVar97;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    puVar40[-0x10] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[-0xf] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[-0xd] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[-0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[-0xb] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[-10] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[-9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40[-8] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[-7] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[-6] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[-5] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[-4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[-3] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[-2] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[-1] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    uVar127 = sVar126 * 0x12 + sVar98;
    uVar133 = sVar132 * 0x10 + sVar99;
    uVar136 = sVar135 * 0xf + sVar100;
    uVar139 = sVar138 * 0xd + sVar101;
    uVar142 = sVar141 * 0xc + sVar102;
    uVar145 = sVar144 * 10 + sVar103;
    uVar148 = sVar147 * 9 + sVar104;
    uVar151 = sVar150 * 8 + sVar105;
    uVar128 = uVar127 >> 8;
    uVar134 = uVar133 >> 8;
    uVar137 = uVar136 >> 8;
    uVar140 = uVar139 >> 8;
    uVar143 = uVar142 >> 8;
    uVar146 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = uVar151 >> 8;
    uVar106 = sVar126 * 7 + sVar41;
    uVar111 = sVar132 * 6 + sVar43;
    uVar113 = sVar135 * 6 + sVar44;
    uVar115 = sVar138 * 5 + sVar45;
    uVar117 = sVar141 * 5 + sVar46;
    uVar119 = sVar144 * 4 + sVar47;
    uVar121 = sVar147 * 4 + sVar48;
    uVar123 = sVar150 * 4 + sVar49;
    uVar107 = uVar106 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar120 = uVar119 >> 8;
    uVar122 = uVar121 >> 8;
    uVar124 = uVar123 >> 8;
    *puVar40 = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar40[1] = (uVar134 != 0) * (uVar134 < 0x100) * (char)(uVar133 >> 8) - (0xff < uVar134);
    puVar40[2] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar40[3] = (uVar140 != 0) * (uVar140 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar140);
    puVar40[4] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar40[5] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar146);
    puVar40[6] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar40[7] = (uVar152 != 0) * (uVar152 < 0x100) * (char)(uVar151 >> 8) - (0xff < uVar152);
    puVar40[8] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar40[9] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar40[10] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar40[0xb] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar40[0xc] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar40[0xd] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar40[0xe] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar40[0xf] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar40 = puVar40 + stride;
  } while (uVar39 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left3 = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left3, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left4 = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left4, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}